

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O3

int stb_lex_item_wild(stb_matcher *matcher,char *regex,int result)

{
  char cVar1;
  ushort uVar2;
  int iVar3;
  uint uVar4;
  uint to;
  __int32_t **pp_Var5;
  __int32_t **pp_Var6;
  __int32_t type;
  
  uVar2 = matcher->start_node;
  uVar4 = stb__add_node(matcher);
  stb__add_epsilon(matcher,(uint)uVar2,uVar4 & 0xffff);
  do {
    cVar1 = *regex;
    to = stb__add_node(matcher);
    if (cVar1 == '*') {
      uVar4 = uVar4 & 0xffff;
      stb__add_edge(matcher,uVar4,to,-1);
      stb__add_epsilon(matcher,uVar4,to);
      stb__add_epsilon(matcher,to,uVar4);
    }
    else {
      if (cVar1 == '?') {
        type = -1;
      }
      else {
        if (cVar1 == '\0') {
          stb__add_edge(matcher,uVar4 & 0xffff,to,0);
          stb__lex_reset(matcher);
          matcher->nodes[to & 0xffff].goal = (stb_int16)result;
          return 1;
        }
        pp_Var5 = __ctype_toupper_loc();
        cVar1 = *regex;
        iVar3 = (*pp_Var5)[cVar1];
        pp_Var6 = __ctype_tolower_loc();
        if (iVar3 == (*pp_Var6)[cVar1]) {
          type = (__int32_t)cVar1;
        }
        else {
          stb__add_edge(matcher,uVar4 & 0xffff,to,(*pp_Var6)[cVar1]);
          type = (*pp_Var5)[*regex];
        }
      }
      stb__add_edge(matcher,uVar4 & 0xffff,to,type);
    }
    regex = regex + 1;
    uVar4 = to;
  } while( true );
}

Assistant:

int stb_lex_item_wild(stb_matcher *matcher, char *regex, int result)
{
   char *z;
   stb_uint16 end;

   z = stb__wild_parse(matcher, matcher->start_node, regex, &end);

   if (z == NULL)
      return 0;

   stb__lex_reset(matcher);

   matcher->nodes[(int) end].goal = result;
   return 1;
}